

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::MultiplyPropagateStatistics::Operation<int,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  Value local_70;
  
  iVar3 = NumericStats::GetMin<int>(lstats);
  iVar4 = NumericStats::GetMax<int>(lstats);
  iVar5 = NumericStats::GetMin<int>(rstats);
  iVar6 = NumericStats::GetMax<int>(rstats);
  iVar7 = 0x7fffffff;
  iVar9 = -0x80000000;
  bVar2 = true;
  do {
    bVar8 = bVar2;
    iVar11 = iVar5;
    bVar2 = true;
    do {
      bVar10 = bVar2;
      uVar1 = (long)iVar11 * (long)iVar3 - 1000000000;
      if (uVar1 < 0xffffffff88ca6c01) goto LAB_01481e2a;
      iVar11 = (int)((long)iVar11 * (long)iVar3);
      if (iVar11 <= iVar7) {
        iVar7 = iVar11;
      }
      if (iVar9 <= iVar11) {
        iVar9 = iVar11;
      }
      iVar11 = iVar6;
      bVar2 = false;
    } while (bVar10);
    iVar3 = iVar4;
    bVar2 = false;
  } while (bVar8);
  Value::Numeric(&local_70,type,(long)iVar7);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)iVar9);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
LAB_01481e2a:
  return uVar1 < 0xffffffff88ca6c01;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}